

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_roa_request.cpp
# Opt level: O2

int __thiscall AliRoaRequest::CommitRequest(AliRoaRequest *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  int iVar2;
  iterator iVar3;
  string sign;
  allocator<char> local_222;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string compose_url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string gmt_time;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  getHttpGmtTime_abi_cxx11_();
  std::operator+(&compose_url,&(this->super_AliHttpRequest).method_,anon_var_dwarf_d4013 + 8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sign,"Accept",(allocator<char> *)&local_220);
  this_00 = &(this->super_AliHttpRequest).map_request_headers_;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&sign);
  p_Var1 = &(this->super_AliHttpRequest).map_request_headers_._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)&sign);
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sign,"Accept",(allocator<char> *)&local_220);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](this_00,&sign);
    std::__cxx11::string::append((string *)&compose_url);
    std::__cxx11::string::~string((string *)&sign);
  }
  std::__cxx11::string::append((char *)&compose_url);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sign,"Content-Md5",(allocator<char> *)&local_220);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&sign);
  std::__cxx11::string::~string((string *)&sign);
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sign,"Content-Md5",(allocator<char> *)&local_220);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](this_00,&sign);
    std::__cxx11::string::append((string *)&compose_url);
    std::__cxx11::string::~string((string *)&sign);
  }
  std::__cxx11::string::append((char *)&compose_url);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sign,"Content-Type",(allocator<char> *)&local_220);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&sign);
  std::__cxx11::string::~string((string *)&sign);
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sign,"Content-Type",(allocator<char> *)&local_220);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](this_00,&sign);
    std::__cxx11::string::append((string *)&compose_url);
    std::__cxx11::string::~string((string *)&sign);
  }
  std::__cxx11::string::append((char *)&compose_url);
  std::__cxx11::string::append((string *)&compose_url);
  std::__cxx11::string::append((char *)&compose_url);
  std::__cxx11::string::append((char *)&compose_url);
  std::__cxx11::string::append((char *)&compose_url);
  std::operator+(&local_220,"x-acs-version:",&this->version_);
  std::operator+(&sign,&local_220,anon_var_dwarf_d4013 + 8);
  std::__cxx11::string::append((string *)&compose_url);
  std::__cxx11::string::~string((string *)&sign);
  std::__cxx11::string::~string((string *)&local_220);
  AliHttpRequest::GetPath_abi_cxx11_(&sign,&this->super_AliHttpRequest,true);
  std::__cxx11::string::append((string *)&compose_url);
  std::__cxx11::string::~string((string *)&sign);
  std::__cxx11::string::string((string *)&local_40,(string *)&this->secret_);
  encode_compute_hmac_sha1
            (&sign,&local_40,compose_url._M_dataplus._M_p,(int)compose_url._M_string_length);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Authorization",&local_221)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"acs ",&local_222);
  std::operator+(&local_1e0,&local_a0,&this->appid_);
  std::operator+(&local_220,&local_1e0,":");
  std::operator+(&local_80,&local_220,&sign);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"x-acs-signature-method",(allocator<char> *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"HMAC-SHA1",(allocator<char> *)&local_1e0);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"x-acs-signature-version",(allocator<char> *)&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"1.0",(allocator<char> *)&local_1e0);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_100,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"x-acs-version",(allocator<char> *)&local_220);
  std::__cxx11::string::string((string *)&local_160,(string *)&this->version_);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"Date",(allocator<char> *)&local_220);
  std::__cxx11::string::string((string *)&local_1a0,(string *)&gmt_time);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_180,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  iVar2 = AliHttpRequest::CommitRequest(&this->super_AliHttpRequest);
  std::__cxx11::string::~string((string *)&sign);
  std::__cxx11::string::~string((string *)&compose_url);
  std::__cxx11::string::~string((string *)&gmt_time);
  return iVar2;
}

Assistant:

int AliRoaRequest::CommitRequest() {
  std::string gmt_time = getHttpGmtTime();

  std::string compose_url = this->method_ + "\n";
  if(map_request_headers_.find("Accept") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Accept"]);
  }
  compose_url.append("\n");
  if(map_request_headers_.find("Content-Md5") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Content-Md5"]);
  } 
  compose_url.append("\n");
  if(map_request_headers_.find("Content-Type") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Content-Type"]);
  }

  compose_url.append("\n");
  compose_url.append(gmt_time);
  compose_url.append("\n");
  compose_url.append("x-acs-signature-method:HMAC-SHA1\n");
  compose_url.append("x-acs-signature-version:1.0\n");
  compose_url.append("x-acs-version:" + version_ + "\n");
  compose_url.append(this->GetPath());

  ALI_LOG("compose_url=%s\n", compose_url.c_str());

  std::string sign = encode_compute_hmac_sha1(this->secret_, (char *)compose_url.c_str(), compose_url.size());

  AddRequestHeader("Authorization", std::string("acs ") + appid_ + ":" + sign);
  AddRequestHeader("x-acs-signature-method", "HMAC-SHA1");
  AddRequestHeader("x-acs-signature-version", "1.0");
  AddRequestHeader("x-acs-version", version_);
  AddRequestHeader("Date", gmt_time);
  return AliHttpRequest::CommitRequest();
}